

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filenames.cc
# Opt level: O1

string_view __thiscall wabt::StripExtension(wabt *this,string_view filename)

{
  char *pcVar1;
  wabt *pwVar2;
  wabt *pwVar3;
  size_type __size;
  string_view sVar4;
  
  pwVar3 = this;
  if (this == (wabt *)0x0) {
LAB_001873d0:
    pwVar2 = (wabt *)0xffffffffffffffff;
  }
  else {
    do {
      pwVar2 = pwVar3 + -1;
      if (pwVar3 == (wabt *)0x0) goto LAB_001873d0;
      pcVar1 = (char *)filename._M_len + -1 + (long)pwVar3;
      pwVar3 = pwVar2;
    } while (*pcVar1 != '.');
  }
  if (this < pwVar2) {
    pwVar2 = this;
  }
  sVar4._M_str = (char *)filename._M_len;
  sVar4._M_len = (size_t)pwVar2;
  return sVar4;
}

Assistant:

std::string_view StripExtension(std::string_view filename) {
  return filename.substr(0, filename.find_last_of('.'));
}